

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_resolve(char *host,char *buf,size_t n)

{
  int iVar1;
  hostent *phVar2;
  char *pcVar3;
  int *piVar4;
  
  phVar2 = gethostbyname(host);
  if (phVar2 != (hostent *)0x0) {
    pcVar3 = inet_ntoa((in_addr)*(in_addr_t *)*phVar2->h_addr_list);
    iVar1 = snprintf(buf,n,"%s",pcVar3);
    return iVar1;
  }
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_resolve2");
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    cs_log_printf("gethostbyname(%s) failed: %s",host,pcVar3);
  }
  return 0;
}

Assistant:

int mg_resolve(const char *host, char *buf, size_t n) {
    struct in_addr ad;
    return mg_resolve2(host, &ad) ? snprintf(buf, n, "%s", inet_ntoa(ad)) : 0;
}